

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_common.c
# Opt level: O2

uint8_t * apx_vm_parse_uint32_by_variant
                    (uint8_t *begin,uint8_t *end,uint8_t variant,uint32_t *number)

{
  uint32_t uVar1;
  uint8_t *puVar2;
  
  uVar1 = apx_vm_variant_to_size(variant);
  if ((uVar1 == 0) || (puVar2 = begin + uVar1, end < puVar2)) {
    puVar2 = (uint8_t *)0x0;
  }
  else {
    uVar1 = unpackLE(begin,(uint8_t)uVar1);
    *number = uVar1;
  }
  return puVar2;
}

Assistant:

uint8_t const* apx_vm_parse_uint32_by_variant(uint8_t const* begin, uint8_t const* end, uint8_t variant, uint32_t* number)
{
   uint8_t const* next = begin;
   uint8_t const unpack_size = (uint8_t)apx_vm_variant_to_size(variant);
   if ((unpack_size == 0) || (next + unpack_size) > end)
   {
      return NULL;
   }
   *number = (uint32_t)unpackLE(next, unpack_size);
   return next + unpack_size;
}